

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int LEintfloat(lua_Integer i,lua_Number f)

{
  bool bVar1;
  
  if (i + 0x20000000000000U < 0x40000000000001) {
    bVar1 = (double)i <= f;
  }
  else {
    bVar1 = true;
    if (f < 9.223372036854776e+18) {
      if (-9.223372036854776e+18 <= f) {
        bVar1 = i <= (long)f;
      }
      else {
        bVar1 = false;
      }
    }
  }
  return (int)bVar1;
}

Assistant:

static int LEintfloat (lua_Integer i, lua_Number f) {
#if defined(l_intfitsf)
  if (!l_intfitsf(i)) {
    if (f >= -cast_num(LUA_MININTEGER))  /* -minint == maxint + 1 */
      return 1;  /* f >= maxint + 1 > i */
    else if (f >= cast_num(LUA_MININTEGER))  /* minint <= f <= maxint ? */
      return (i <= cast(lua_Integer, f));  /* compare them as integers */
    else  /* f < minint <= i (or 'f' is NaN)  -->  not(i <= f) */
      return 0;
  }
#endif
  return luai_numle(cast_num(i), f);  /* compare them as floats */
}